

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

BlindingKeyResponseStruct * __thiscall
cfd::js::api::json::BlindingKeyResponse::ConvertToStruct
          (BlindingKeyResponseStruct *__return_storage_ptr__,BlindingKeyResponse *this)

{
  BlindingKeyResponse *this_local;
  BlindingKeyResponseStruct *result;
  
  BlindingKeyResponseStruct::BlindingKeyResponseStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->blinding_key_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

BlindingKeyResponseStruct BlindingKeyResponse::ConvertToStruct() const {  // NOLINT
  BlindingKeyResponseStruct result;
  result.blinding_key = blinding_key_;
  result.ignore_items = ignore_items;
  return result;
}